

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

void cleanUpExecutedProcess
               (ProcessDelegate *delegate,ProcessGroup *pgrp,llbuild_pid_t pid,ProcessHandle handle,
               ProcessContext *ctx,ProcessCompletionFn *completionFn,ManagedDescriptor *releaseFd)

{
  ProcessResult __args;
  ProcessResult __args_00;
  anon_union_8_2_1ea8062a_for_rusage_28 aVar1;
  int *piVar2;
  char *Str;
  int __fd;
  void *__stat_loc;
  bool bVar3;
  ProcessStatus local_240;
  bool local_23a;
  bool local_239;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint64_t local_1f8;
  uint64_t local_1f0;
  undefined1 local_1e8 [8];
  ProcessResult processResult;
  ProcessStatus processStatus;
  bool cancelled;
  uint64_t stime;
  uint64_t utime;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  uint64_t local_188;
  uint64_t local_180;
  Twine local_178;
  Twine local_160;
  Twine local_148;
  Twine local_130;
  Twine local_118;
  uint64_t local_100;
  undefined1 local_f8 [8];
  ProcessResult result_1;
  int result;
  int exitCode;
  rusage usage;
  ProcessCompletionFn *completionFn_local;
  ProcessContext *ctx_local;
  llbuild_pid_t pid_local;
  ProcessGroup *pgrp_local;
  ProcessDelegate *delegate_local;
  ProcessHandle handle_local;
  
  __stat_loc = (void *)((long)&result_1.maxrss + 4);
  usage.field_15 = (anon_union_8_2_1ea8062a_for_rusage_28)completionFn;
  result_1.maxrss._0_4_ = wait4(pid,__stat_loc,0,(rusage *)&result);
  while( true ) {
    __fd = (int)__stat_loc;
    bVar3 = false;
    if ((__pid_t)result_1.maxrss == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
    if (!bVar3) break;
    __stat_loc = (void *)((long)&result_1.maxrss + 4);
    result_1.maxrss._0_4_ = wait4(pid,__stat_loc,0,(rusage *)&result);
  }
  ManagedDescriptor::close(releaseFd,__fd);
  llbuild::basic::ProcessGroup::remove(pgrp,(char *)(ulong)(uint)pid);
  if ((__pid_t)result_1.maxrss == -1) {
    llbuild::basic::ProcessResult::makeFailed((ProcessResult *)local_f8,result_1.maxrss._4_4_);
    local_100 = handle.id;
    llvm::Twine::Twine(&local_148,"unable to wait for process (");
    piVar2 = __errno_location();
    Str = strerror(*piVar2);
    llvm::Twine::Twine(&local_160,Str);
    llvm::operator+(&local_130,&local_148,&local_160);
    llvm::Twine::Twine(&local_178,")");
    llvm::operator+(&local_118,&local_130,&local_178);
    (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,local_100,&local_118);
    local_180 = handle.id;
    (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,handle.id,local_f8);
    aVar1 = usage.field_15;
    memcpy(&utime,local_f8,0x28);
    __args._8_8_ = uStack_1a0;
    __args.status = (undefined4)utime;
    __args.exitCode = utime._4_4_;
    __args.utime = local_198;
    __args.stime = uStack_190;
    __args.maxrss = local_188;
    std::function<void_(llbuild::basic::ProcessResult)>::operator()
              ((function<void_(llbuild::basic::ProcessResult)> *)aVar1,__args);
  }
  else {
    local_239 = false;
    if ('\0' < (char)(((byte)result_1.maxrss._4_4_ & 0x7f) + 1) >> 1) {
      local_23a = (result_1.maxrss._4_4_ & 0x7f) == 2 || (result_1.maxrss._4_4_ & 0x7f) == 9;
      local_239 = local_23a;
    }
    processResult.maxrss._7_1_ = local_239;
    if (local_239 == false) {
      local_240 = (ProcessStatus)(result_1.maxrss._4_4_ != 0);
    }
    else {
      local_240 = Cancelled;
    }
    processResult.maxrss._0_4_ = local_240;
    llbuild::basic::ProcessResult::ProcessResult
              ((ProcessResult *)local_1e8,local_240,result_1.maxrss._4_4_,pid,
               _result * 1000000 + usage.ru_utime.tv_sec,
               usage.ru_utime.tv_usec * 1000000 + usage.ru_stime.tv_sec,usage.ru_stime.tv_usec);
    local_1f0 = handle.id;
    (*delegate->_vptr_ProcessDelegate[5])(delegate,ctx,handle.id,local_1e8);
    aVar1 = usage.field_15;
    memcpy(&local_218,local_1e8,0x28);
    __args_00._8_8_ = uStack_210;
    __args_00.status = (undefined4)local_218;
    __args_00.exitCode = local_218._4_4_;
    __args_00.utime = local_208;
    __args_00.stime = uStack_200;
    __args_00.maxrss = local_1f8;
    std::function<void_(llbuild::basic::ProcessResult)>::operator()
              ((function<void_(llbuild::basic::ProcessResult)> *)aVar1,__args_00);
  }
  return;
}

Assistant:

static void cleanUpExecutedProcess(ProcessDelegate& delegate,
                                   ProcessGroup& pgrp, llbuild_pid_t pid,
                                   ProcessHandle handle, ProcessContext* ctx,
                                   ProcessCompletionFn&& completionFn,
                                   ManagedDescriptor& releaseFd) {
#if defined(_WIN32)
  FILETIME creationTime;
  FILETIME exitTime;
  FILETIME utimeTicks;
  FILETIME stimeTicks;
  int waitResult = WaitForSingleObject(pid, INFINITE);
  int err = GetLastError();
  DWORD exitCode = 0;
  GetExitCodeProcess(pid, &exitCode);

  if (waitResult == WAIT_FAILED || waitResult == WAIT_ABANDONED) {
    releaseFd.close();
    auto result = ProcessResult::makeFailed(exitCode);
    delegate.processHadError(ctx, handle,
                             Twine("unable to wait for process (") +
                                 sys::strerror(GetLastError()) + ")");
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }
#else
  // Wait for the command to complete.
  struct rusage usage;
  int exitCode, result = wait4(pid, &exitCode, 0, &usage);
  while (result == -1 && errno == EINTR)
    result = wait4(pid, &exitCode, 0, &usage);
#endif
  // Close the release pipe
  //
  // Note: We purposely hold this open until after the process has finished as
  // it simplifies client implentation. If we close it early, clients need to be
  // aware of and potentially handle a SIGPIPE.
  releaseFd.close();

  // Update the set of spawned processes.
  pgrp.remove(pid);
#if defined(_WIN32)
  PROCESS_MEMORY_COUNTERS counters;
  bool res =
      GetProcessTimes(pid, &creationTime, &exitTime, &stimeTicks, &utimeTicks);
  if (!res) {
    auto result = ProcessResult::makeCancelled();
    delegate.processHadError(ctx, handle,
                             Twine("unable to get statistics for process: ") +
                                 sys::strerror(GetLastError()) + ")");
    delegate.processFinished(ctx, handle, result);
    return;
  }
  // Each tick is 100ns
  uint64_t utime =
      ((uint64_t)utimeTicks.dwHighDateTime << 32 | utimeTicks.dwLowDateTime) /
      10;
  uint64_t stime =
      ((uint64_t)stimeTicks.dwHighDateTime << 32 | stimeTicks.dwLowDateTime) /
      10;
  GetProcessMemoryInfo(pid, &counters, sizeof(counters));

  // We report additional info in the tracing interval
  //   - user time, in µs
  //   - sys time, in µs
  //   - memory usage, in bytes

  // FIXME: We should report a statistic for how much output we read from the
  // subprocess (probably as a new point sample).

  // Notify of the process completion.
  ProcessStatus processStatus =
      (exitCode == 0) ? ProcessStatus::Succeeded : ProcessStatus::Failed;
  ProcessResult processResult(processStatus, exitCode, pid, utime, stime,
                              counters.PeakWorkingSetSize);
#else  // !defined(_WIN32)
  if (result == -1) {
    auto result = ProcessResult::makeFailed(exitCode);
    delegate.processHadError(ctx, handle,
                             Twine("unable to wait for process (") +
                                 strerror(errno) + ")");
    delegate.processFinished(ctx, handle, result);
    completionFn(result);
    return;
  }

  // We report additional info in the tracing interval
  //   - user time, in µs
  //   - sys time, in µs
  //   - memory usage, in bytes
  uint64_t utime = (uint64_t(usage.ru_utime.tv_sec) * 1000000 +
                    uint64_t(usage.ru_utime.tv_usec));
  uint64_t stime = (uint64_t(usage.ru_stime.tv_sec) * 1000000 +
                    uint64_t(usage.ru_stime.tv_usec));

  // FIXME: We should report a statistic for how much output we read from the
  // subprocess (probably as a new point sample).

  // Notify of the process completion.
  bool cancelled = WIFSIGNALED(exitCode) && (WTERMSIG(exitCode) == SIGINT || WTERMSIG(exitCode) == SIGKILL);
  ProcessStatus processStatus = cancelled ? ProcessStatus::Cancelled : (exitCode == 0) ? ProcessStatus::Succeeded : ProcessStatus::Failed;
  ProcessResult processResult(processStatus, exitCode, pid, utime, stime,
                              usage.ru_maxrss);
#endif // else !defined(_WIN32)
  delegate.processFinished(ctx, handle, processResult);
  completionFn(processResult);
}